

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_char*const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_char*>
          (ExpressionLhs<unsigned_char*const&> *this,uchar **rhs)

{
  ResultBuilder *pRVar1;
  _Alloc_hider in_stack_ffffffffffffff88;
  _Alloc_hider _Var2;
  char local_68 [16];
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,(uchar *)**(long **)(this + 8) == *rhs);
  StringMaker<unsigned_char_*>::convert<unsigned_char>((uchar *)in_stack_ffffffffffffff88._M_p);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  StringMaker<unsigned_char_*>::convert<unsigned_char>((uchar *)in_stack_ffffffffffffff88._M_p);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  _Var2._M_p = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff88,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,(string *)&stack0xffffffffffffff88);
  if (_Var2._M_p != local_68) {
    operator_delete(_Var2._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }